

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

FileDescriptorProto * __thiscall
perfetto::protos::gen::FileDescriptorProto::operator=
          (FileDescriptorProto *this,FileDescriptorProto *param_1)

{
  pointer pbVar1;
  pointer pDVar2;
  pointer pEVar3;
  pointer pFVar4;
  vector<perfetto::protos::gen::DescriptorProto,_std::allocator<perfetto::protos::gen::DescriptorProto>_>
  local_38;
  
  ::std::__cxx11::string::operator=((string *)&this->name_,(string *)&param_1->name_);
  ::std::__cxx11::string::operator=((string *)&this->package_,(string *)&param_1->package_);
  local_38.
  super__Vector_base<perfetto::protos::gen::DescriptorProto,_std::allocator<perfetto::protos::gen::DescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)(this->dependency_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pbVar1 = (param_1->dependency_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38.
  super__Vector_base<perfetto::protos::gen::DescriptorProto,_std::allocator<perfetto::protos::gen::DescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)(this->dependency_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_38.
  super__Vector_base<perfetto::protos::gen::DescriptorProto,_std::allocator<perfetto::protos::gen::DescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)(this->dependency_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  (this->dependency_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_1->dependency_).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->dependency_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar1;
  (this->dependency_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->dependency_).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->dependency_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->dependency_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->dependency_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_38);
  std::vector<int,_std::allocator<int>_>::_M_move_assign
            (&this->public_dependency_,&param_1->public_dependency_);
  std::vector<int,_std::allocator<int>_>::_M_move_assign
            (&this->weak_dependency_,&param_1->weak_dependency_);
  local_38.
  super__Vector_base<perfetto::protos::gen::DescriptorProto,_std::allocator<perfetto::protos::gen::DescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->message_type_).
       super__Vector_base<perfetto::protos::gen::DescriptorProto,_std::allocator<perfetto::protos::gen::DescriptorProto>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pDVar2 = (param_1->message_type_).
           super__Vector_base<perfetto::protos::gen::DescriptorProto,_std::allocator<perfetto::protos::gen::DescriptorProto>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38.
  super__Vector_base<perfetto::protos::gen::DescriptorProto,_std::allocator<perfetto::protos::gen::DescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (this->message_type_).
       super__Vector_base<perfetto::protos::gen::DescriptorProto,_std::allocator<perfetto::protos::gen::DescriptorProto>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_38.
  super__Vector_base<perfetto::protos::gen::DescriptorProto,_std::allocator<perfetto::protos::gen::DescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (this->message_type_).
       super__Vector_base<perfetto::protos::gen::DescriptorProto,_std::allocator<perfetto::protos::gen::DescriptorProto>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->message_type_).
  super__Vector_base<perfetto::protos::gen::DescriptorProto,_std::allocator<perfetto::protos::gen::DescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_1->message_type_).
       super__Vector_base<perfetto::protos::gen::DescriptorProto,_std::allocator<perfetto::protos::gen::DescriptorProto>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->message_type_).
  super__Vector_base<perfetto::protos::gen::DescriptorProto,_std::allocator<perfetto::protos::gen::DescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_finish = pDVar2;
  (this->message_type_).
  super__Vector_base<perfetto::protos::gen::DescriptorProto,_std::allocator<perfetto::protos::gen::DescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->message_type_).
       super__Vector_base<perfetto::protos::gen::DescriptorProto,_std::allocator<perfetto::protos::gen::DescriptorProto>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->message_type_).
  super__Vector_base<perfetto::protos::gen::DescriptorProto,_std::allocator<perfetto::protos::gen::DescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->message_type_).
  super__Vector_base<perfetto::protos::gen::DescriptorProto,_std::allocator<perfetto::protos::gen::DescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->message_type_).
  super__Vector_base<perfetto::protos::gen::DescriptorProto,_std::allocator<perfetto::protos::gen::DescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<perfetto::protos::gen::DescriptorProto,_std::allocator<perfetto::protos::gen::DescriptorProto>_>
  ::~vector(&local_38);
  local_38.
  super__Vector_base<perfetto::protos::gen::DescriptorProto,_std::allocator<perfetto::protos::gen::DescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)(this->enum_type_).
                super__Vector_base<perfetto::protos::gen::EnumDescriptorProto,_std::allocator<perfetto::protos::gen::EnumDescriptorProto>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pEVar3 = (param_1->enum_type_).
           super__Vector_base<perfetto::protos::gen::EnumDescriptorProto,_std::allocator<perfetto::protos::gen::EnumDescriptorProto>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38.
  super__Vector_base<perfetto::protos::gen::DescriptorProto,_std::allocator<perfetto::protos::gen::DescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)(this->enum_type_).
                super__Vector_base<perfetto::protos::gen::EnumDescriptorProto,_std::allocator<perfetto::protos::gen::EnumDescriptorProto>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_38.
  super__Vector_base<perfetto::protos::gen::DescriptorProto,_std::allocator<perfetto::protos::gen::DescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)(this->enum_type_).
                super__Vector_base<perfetto::protos::gen::EnumDescriptorProto,_std::allocator<perfetto::protos::gen::EnumDescriptorProto>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  (this->enum_type_).
  super__Vector_base<perfetto::protos::gen::EnumDescriptorProto,_std::allocator<perfetto::protos::gen::EnumDescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_1->enum_type_).
       super__Vector_base<perfetto::protos::gen::EnumDescriptorProto,_std::allocator<perfetto::protos::gen::EnumDescriptorProto>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->enum_type_).
  super__Vector_base<perfetto::protos::gen::EnumDescriptorProto,_std::allocator<perfetto::protos::gen::EnumDescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_finish = pEVar3;
  (this->enum_type_).
  super__Vector_base<perfetto::protos::gen::EnumDescriptorProto,_std::allocator<perfetto::protos::gen::EnumDescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->enum_type_).
       super__Vector_base<perfetto::protos::gen::EnumDescriptorProto,_std::allocator<perfetto::protos::gen::EnumDescriptorProto>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->enum_type_).
  super__Vector_base<perfetto::protos::gen::EnumDescriptorProto,_std::allocator<perfetto::protos::gen::EnumDescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->enum_type_).
  super__Vector_base<perfetto::protos::gen::EnumDescriptorProto,_std::allocator<perfetto::protos::gen::EnumDescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->enum_type_).
  super__Vector_base<perfetto::protos::gen::EnumDescriptorProto,_std::allocator<perfetto::protos::gen::EnumDescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<perfetto::protos::gen::EnumDescriptorProto,_std::allocator<perfetto::protos::gen::EnumDescriptorProto>_>
  ::~vector((vector<perfetto::protos::gen::EnumDescriptorProto,_std::allocator<perfetto::protos::gen::EnumDescriptorProto>_>
             *)&local_38);
  local_38.
  super__Vector_base<perfetto::protos::gen::DescriptorProto,_std::allocator<perfetto::protos::gen::DescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)(this->extension_).
                super__Vector_base<perfetto::protos::gen::FieldDescriptorProto,_std::allocator<perfetto::protos::gen::FieldDescriptorProto>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pFVar4 = (param_1->extension_).
           super__Vector_base<perfetto::protos::gen::FieldDescriptorProto,_std::allocator<perfetto::protos::gen::FieldDescriptorProto>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38.
  super__Vector_base<perfetto::protos::gen::DescriptorProto,_std::allocator<perfetto::protos::gen::DescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)(this->extension_).
                super__Vector_base<perfetto::protos::gen::FieldDescriptorProto,_std::allocator<perfetto::protos::gen::FieldDescriptorProto>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_38.
  super__Vector_base<perfetto::protos::gen::DescriptorProto,_std::allocator<perfetto::protos::gen::DescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)(this->extension_).
                super__Vector_base<perfetto::protos::gen::FieldDescriptorProto,_std::allocator<perfetto::protos::gen::FieldDescriptorProto>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  (this->extension_).
  super__Vector_base<perfetto::protos::gen::FieldDescriptorProto,_std::allocator<perfetto::protos::gen::FieldDescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_1->extension_).
       super__Vector_base<perfetto::protos::gen::FieldDescriptorProto,_std::allocator<perfetto::protos::gen::FieldDescriptorProto>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->extension_).
  super__Vector_base<perfetto::protos::gen::FieldDescriptorProto,_std::allocator<perfetto::protos::gen::FieldDescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_finish = pFVar4;
  (this->extension_).
  super__Vector_base<perfetto::protos::gen::FieldDescriptorProto,_std::allocator<perfetto::protos::gen::FieldDescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->extension_).
       super__Vector_base<perfetto::protos::gen::FieldDescriptorProto,_std::allocator<perfetto::protos::gen::FieldDescriptorProto>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->extension_).
  super__Vector_base<perfetto::protos::gen::FieldDescriptorProto,_std::allocator<perfetto::protos::gen::FieldDescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->extension_).
  super__Vector_base<perfetto::protos::gen::FieldDescriptorProto,_std::allocator<perfetto::protos::gen::FieldDescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->extension_).
  super__Vector_base<perfetto::protos::gen::FieldDescriptorProto,_std::allocator<perfetto::protos::gen::FieldDescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<perfetto::protos::gen::FieldDescriptorProto,_std::allocator<perfetto::protos::gen::FieldDescriptorProto>_>
  ::~vector((vector<perfetto::protos::gen::FieldDescriptorProto,_std::allocator<perfetto::protos::gen::FieldDescriptorProto>_>
             *)&local_38);
  ::std::__cxx11::string::operator=
            ((string *)&this->unknown_fields_,(string *)&param_1->unknown_fields_);
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_1->_has_field_).super__Base_bitset<1UL>._M_w;
  return this;
}

Assistant:

bool FileDescriptorProto::operator==(const FileDescriptorProto& other) const {
  return unknown_fields_ == other.unknown_fields_
   && name_ == other.name_
   && package_ == other.package_
   && dependency_ == other.dependency_
   && public_dependency_ == other.public_dependency_
   && weak_dependency_ == other.weak_dependency_
   && message_type_ == other.message_type_
   && enum_type_ == other.enum_type_
   && extension_ == other.extension_;
}